

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatScaleAddI(SUNMatrix A,SUNMatrix I,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  uint in_EDX;
  SUNMatrix in_RSI;
  undefined8 in_RDI;
  double tol_00;
  double dVar3;
  sunrealtype tol;
  SUNMatrix B;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  A_00 = (SUNMatrix)SUNMatClone(in_RDI);
  uVar1 = SUNMatCopy(in_RSI,A_00);
  if (uVar1 == 0) {
    tol_00 = get_time();
    uVar1 = SUNMatScaleAddI(0xbff0000000000000,A_00);
    sync_device(A_00);
    dVar3 = get_time();
    if (uVar1 == 0) {
      iVar2 = check_matrix_entry(in_RSI,(sunrealtype)((ulong)in_EDX << 0x20),tol_00);
      if (iVar2 == 0) {
        if ((print_all_ranks == 0) && (in_EDX == 0)) {
          printf("    PASSED test -- SUNMatScaleAddI \n");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)in_EDX);
          printf("    PASSED test -- SUNMatScaleAddI \n");
        }
        if ((in_EDX == 0) && (print_time != 0)) {
          printf("    SUNMatScaleAddI Time: %22.15e \n \n",dVar3 - tol_00);
        }
        SUNMatDestroy(A_00);
        local_4 = 0;
      }
      else {
        if ((print_all_ranks == 0) && (in_EDX == 0)) {
          printf(">>> FAILED test -- SUNMatScaleAddI check \n");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)in_EDX);
          printf(">>> FAILED test -- SUNMatScaleAddI check \n");
        }
        if (print_time != 0) {
          printf("    SUNMatScaleAddI Time: %22.15e \n \n",dVar3 - tol_00);
        }
        SUNMatDestroy(A_00);
        local_4 = 1;
      }
    }
    else {
      if ((print_all_ranks == 0) && (in_EDX == 0)) {
        printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_EDX);
        printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
      }
      SUNMatDestroy(A_00);
      local_4 = 1;
    }
  }
  else {
    if ((print_all_ranks == 0) && (in_EDX == 0)) {
      printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_EDX);
      printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    }
    SUNMatDestroy(A_00);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatScaleAddI(SUNMatrix A, SUNMatrix I, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  /* protect A */
  B = SUNMatClone(A);

  failure = SUNMatCopy(I, B);
  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* perform operation */
  start_time = get_time();
  failure    = SUNMatScaleAddI(NEG_ONE, B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure,
                 myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatScaleAddI check \n", myid);
    PRINT_TIME("    SUNMatScaleAddI Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatScaleAddI \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatScaleAddI Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}